

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

node_type * __thiscall
phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
::new_leaf_root_node
          (btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
           *this,int max_count)

{
  size_type n;
  btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
  *pbVar1;
  
  n = btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>::
      LeafSize(max_count);
  pbVar1 = (btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
            *)Allocate<8ul,std::allocator<int>>((allocator<int> *)this,n);
  pbVar1 = btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
           ::init_leaf(pbVar1,pbVar1,max_count);
  return pbVar1;
}

Assistant:

node_type *new_leaf_root_node(const int max_count) {
            node_type *p = allocate(node_type::LeafSize(max_count));
            return node_type::init_leaf(p, p, max_count);
        }